

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::GetInlineeForTargetInlinee
          (FunctionCodeGenRuntimeData *this,ProfileId profiledCallSiteId,
          FunctionBody *inlineeFuncBody)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> **ppWVar6;
  FunctionCodeGenRuntimeData **ppFVar7;
  FunctionCodeGenRuntimeData *local_30;
  FunctionCodeGenRuntimeData *runtimeData;
  FunctionBody *inlineeFuncBody_local;
  ProfileId profiledCallSiteId_local;
  FunctionCodeGenRuntimeData *this_local;
  
  pFVar4 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->functionBody);
  PVar3 = FunctionBody::GetProfiledCallSiteCount(pFVar4);
  if (PVar3 <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x33,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->inlinees);
  if (*ppWVar6 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    this_local = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->inlinees);
    ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)(*ppWVar6 + profiledCallSiteId));
    local_30 = *ppFVar7;
    while( true ) {
      bVar2 = false;
      if (local_30 != (FunctionCodeGenRuntimeData *)0x0) {
        pFVar4 = GetFunctionBody(local_30);
        bVar2 = pFVar4 != inlineeFuncBody;
      }
      if (!bVar2) break;
      ppFVar7 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                          ((WriteBarrierPtr *)&local_30->next);
      local_30 = *ppFVar7;
    }
    this_local = local_30;
  }
  return this_local;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionCodeGenRuntimeData::GetInlineeForTargetInlinee(const ProfileId profiledCallSiteId, FunctionBody *inlineeFuncBody) const
    {
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());

        if (!inlinees)
        {
            return nullptr;
        }
        FunctionCodeGenRuntimeData *runtimeData = inlinees[profiledCallSiteId];
        while (runtimeData && runtimeData->GetFunctionBody() != inlineeFuncBody)
        {
            runtimeData = runtimeData->next;
        }
        return runtimeData;
    }